

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolor.cpp
# Opt level: O3

int __thiscall QColor::hsvSaturation(QColor *this)

{
  uint uVar1;
  long in_FS_OFFSET;
  QColor QVar2;
  QColor local_18;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->cspec & ~Hsv) == Invalid) {
    uVar1 = (this->ct).argb.green + 0x80;
    uVar1 = uVar1 - (uVar1 >> 8) >> 8;
  }
  else {
    QVar2 = toHsv(this);
    local_18._0_8_ = QVar2._0_8_;
    local_18.ct._4_4_ = QVar2.ct._4_4_;
    local_18.ct.argb.pad = QVar2.ct._8_2_;
    uVar1 = hsvSaturation(&local_18);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return uVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QColor::hsvSaturation() const noexcept
{
    if (cspec != Invalid && cspec != Hsv)
        return toHsv().saturation();
    return qt_div_257(ct.ahsv.saturation);
}